

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::NumberFormat::format
          (NumberFormat *this,DecimalQuantity *number,UnicodeString *appendTo,FieldPosition *pos,
          UErrorCode *status)

{
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::number::impl::DecimalQuantity::toDouble(number);
    (*(this->super_Format).super_UObject._vptr_UObject[9])(this,appendTo,pos,status);
  }
  return appendTo;
}

Assistant:

UnicodeString&
NumberFormat::format(const number::impl::DecimalQuantity &number,
                     UnicodeString& appendTo,
                     FieldPosition& pos,
                     UErrorCode &status) const {
    // DecimalFormat overrides this function, and handles DigitList based big decimals.
    // Other subclasses (ChoiceFormat) do not (yet) handle DigitLists,
    // so this default implementation falls back to formatting decimal numbers as doubles.
    if (U_FAILURE(status)) {
        return appendTo;
    }
    double dnum = number.toDouble();
    format(dnum, appendTo, pos, status);
    return appendTo;
}